

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O1

void __thiscall Clasp::mt::ParallelSolve::~ParallelSolve(ParallelSolve *this)

{
  uint uVar1;
  SharedData *pSVar2;
  pointer pppVar3;
  double dVar4;
  uint uVar5;
  bool bVar6;
  
  (this->super_SolveAlgorithm)._vptr_SolveAlgorithm = (_func_int **)&PTR__ParallelSolve_001eb238;
  pSVar2 = this->shared_;
  if (1 < pSVar2->nextId) {
    uVar5 = (pSVar2->control).super___atomic_base<unsigned_int>._M_i;
    do {
      LOCK();
      uVar1 = (pSVar2->control).super___atomic_base<unsigned_int>._M_i;
      bVar6 = uVar5 == uVar1;
      if (bVar6) {
        (pSVar2->control).super___atomic_base<unsigned_int>._M_i = uVar5 | 0x21;
        uVar1 = uVar5;
      }
      uVar5 = uVar1;
      UNLOCK();
    } while (!bVar6);
    if ((~uVar5 & 0x21) != 0) {
      (pSVar2->syncT).start_ = 0.0;
      (pSVar2->syncT).split_ = 0.0;
      (pSVar2->syncT).total_ = 0.0;
      dVar4 = RealTime::getTime();
      (pSVar2->syncT).start_ = dVar4;
    }
    SharedData::notifyWaitingThreads(this->shared_,(unique_lock<std::mutex> *)0x0,0);
    joinThreads(this);
  }
  destroyThread(this,0);
  pSVar2 = this->shared_;
  if (pSVar2 != (SharedData *)0x0) {
    pppVar3 = (pSVar2->workQ).vec.ebo_.buf;
    if (pppVar3 != (pointer)0x0) {
      operator_delete(pppVar3);
    }
    std::condition_variable::~condition_variable(&(pSVar2->workCond).super_condition_variable);
    SingleOwnerPtr<Clasp::mt::ParallelSolve::SharedData::Generator,_Clasp::DeleteObject>::reset
              (&pSVar2->generator,(Generator *)0x0);
    Potassco::StringBuilder::~StringBuilder(&pSVar2->msg);
    operator_delete(pSVar2);
  }
  SolveAlgorithm::~SolveAlgorithm(&this->super_SolveAlgorithm);
  return;
}

Assistant:

ParallelSolve::~ParallelSolve() {
	if (shared_->nextId > 1) {
		// algorithm was not started but there may be active threads -
		// force orderly shutdown
		ParallelSolve::doInterrupt();
		shared_->notifyWaitingThreads();
		joinThreads();
	}
	destroyThread(masterId);
	delete shared_;
}